

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type.cc
# Opt level: O0

void __thiscall iqxmlrpc::Date_time::Date_time(Date_time *this,string *s)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  Malformed_iso8601 *pMVar4;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  undefined5 local_38;
  undefined3 uStack_33;
  char alpha [13];
  string *s_local;
  Date_time *this_local;
  
  Value_type::Value_type(&this->super_Value_type);
  (this->super_Value_type)._vptr_Value_type = (_func_int **)&PTR__Date_time_00254e30;
  std::__cxx11::string::string((string *)&this->cache);
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 0x11) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
    if (*pcVar3 == 'T') {
      builtin_strncpy(alpha,"89T:",5);
      local_38 = 0x3433323130;
      uStack_33 = 0x373635;
      std::__cxx11::string::substr((ulong)local_58,(ulong)s);
      lVar2 = std::__cxx11::string::find_first_not_of((char *)local_58,(ulong)&local_38);
      std::__cxx11::string::~string(local_58);
      if (lVar2 != -1) {
        pMVar4 = (Malformed_iso8601 *)__cxa_allocate_exception(0x18);
        Malformed_iso8601::Malformed_iso8601(pMVar4);
        __cxa_throw(pMVar4,&Malformed_iso8601::typeinfo,Malformed_iso8601::~Malformed_iso8601);
      }
      std::__cxx11::string::substr((ulong)local_78,(ulong)s);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iVar1 = atoi(pcVar3);
      (this->tm_).tm_year = iVar1 + -0x76c;
      std::__cxx11::string::~string(local_78);
      std::__cxx11::string::substr((ulong)local_98,(ulong)s);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iVar1 = atoi(pcVar3);
      (this->tm_).tm_mon = iVar1 + -1;
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::substr((ulong)local_b8,(ulong)s);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iVar1 = atoi(pcVar3);
      (this->tm_).tm_mday = iVar1;
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::substr((ulong)local_d8,(ulong)s);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iVar1 = atoi(pcVar3);
      (this->tm_).tm_hour = iVar1;
      std::__cxx11::string::~string(local_d8);
      std::__cxx11::string::substr((ulong)local_f8,(ulong)s);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iVar1 = atoi(pcVar3);
      (this->tm_).tm_min = iVar1;
      std::__cxx11::string::~string(local_f8);
      std::__cxx11::string::substr((ulong)local_118,(ulong)s);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iVar1 = atoi(pcVar3);
      (this->tm_).tm_sec = iVar1;
      std::__cxx11::string::~string(local_118);
      if ((((((-1 < (this->tm_).tm_year) && (-1 < (this->tm_).tm_mon)) && ((this->tm_).tm_mon < 0xc)
            ) && ((0 < (this->tm_).tm_mday && ((this->tm_).tm_mday < 0x20)))) &&
          ((-1 < (this->tm_).tm_hour && (((this->tm_).tm_hour < 0x18 && (-1 < (this->tm_).tm_min))))
          )) && (((this->tm_).tm_min < 0x3c &&
                 ((-1 < (this->tm_).tm_sec && ((this->tm_).tm_sec < 0x3e)))))) {
        return;
      }
      pMVar4 = (Malformed_iso8601 *)__cxa_allocate_exception(0x18);
      Malformed_iso8601::Malformed_iso8601(pMVar4);
      __cxa_throw(pMVar4,&Malformed_iso8601::typeinfo,Malformed_iso8601::~Malformed_iso8601);
    }
  }
  pMVar4 = (Malformed_iso8601 *)__cxa_allocate_exception(0x18);
  Malformed_iso8601::Malformed_iso8601(pMVar4);
  __cxa_throw(pMVar4,&Malformed_iso8601::typeinfo,Malformed_iso8601::~Malformed_iso8601);
}

Assistant:

Date_time::Date_time( const std::string& s )
{
  if( s.length() != 17 || s[8] != 'T' )
    throw Malformed_iso8601();

  char alpha[] = "0123456789T:";
  if( s.substr(0, 16).find_first_not_of(alpha) != std::string::npos )
    throw Malformed_iso8601();

  tm_.tm_year = atoi( s.substr(0, 4).c_str() ) - 1900;
  tm_.tm_mon  = atoi( s.substr(4, 2).c_str() ) - 1;
  tm_.tm_mday = atoi( s.substr(6, 2).c_str() );
  tm_.tm_hour = atoi( s.substr(9, 2).c_str() );
  tm_.tm_min  = atoi( s.substr(12, 2).c_str() );
  tm_.tm_sec  = atoi( s.substr(15, 2).c_str() );

  if( (tm_.tm_year < 0) || !(tm_.tm_mon >= 0 && tm_.tm_mon <= 11) ||
      !(tm_.tm_mday >= 1 && tm_.tm_mday <= 31) ||
      !(tm_.tm_hour >= 0 && tm_.tm_hour <= 23) ||
      !(tm_.tm_min >= 0 && tm_.tm_min <= 59) ||
      !(tm_.tm_sec >= 0 && tm_.tm_sec <= 61)
    )
    throw Malformed_iso8601();
}